

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_420.cpp
# Opt level: O0

int __thiscall YUV420::ReadFromYUVFile(YUV420 *this,string *filename)

{
  uint8_t *puVar1;
  size_t sVar2;
  uint8_t *puVar3;
  size_t sVar4;
  uint8_t *puVar5;
  double dVar6;
  undefined1 auVar7 [16];
  byte bVar8;
  _Ios_Openmode _Var9;
  streamoff __off;
  ulong uVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  uint8_t local_2f1;
  ulong uStack_2f0;
  uint8_t temp_1;
  size_t j_1;
  size_t i_1;
  ulong uStack_2d8;
  uint8_t temp;
  size_t j;
  size_t i;
  __mbstate_t local_2c0;
  fpos<__mbstate_t> local_2b8;
  undefined1 auStack_2a8 [8];
  streampos fsize;
  function<void_()> local_290;
  undefined1 local_270 [8];
  DeferredAction __deferred__27;
  char local_240 [8];
  ifstream infile;
  uint8_t_0_ *v;
  uint8_t_0_ *u;
  uint8_t_0_ *y;
  string *filename_local;
  YUV420 *this_local;
  
  puVar1 = this->y_;
  sVar2 = this->width_;
  puVar3 = this->u_;
  sVar4 = this->width_;
  puVar5 = this->v_;
  _Var9 = std::operator|(_S_in,_S_bin);
  _Var9 = std::operator|(_Var9,_S_ate);
  std::ifstream::ifstream(local_240,(string *)filename,_Var9);
  bVar8 = std::ifstream::is_open();
  if ((bVar8 & 1) == 0) {
    this_local._4_4_ = -1;
    __deferred__27.f_._M_invoker._0_4_ = 1;
  }
  else {
    fsize._M_state = (__mbstate_t)local_240;
    std::function<void()>::function<YUV420::ReadFromYUVFile(std::__cxx11::string_const&)::__0,void>
              ((function<void()> *)&local_290,(anon_class_8_1_5a8ed95f *)&fsize._M_state);
    DeferredAction::DeferredAction((DeferredAction *)local_270,&local_290);
    CLI::std::function<void_()>::~function(&local_290);
    auVar12 = std::istream::tellg();
    fsize._M_off = auVar12._8_8_;
    auStack_2a8 = auVar12._0_8_;
    std::istream::seekg((long)local_240,_S_beg);
    auVar12 = std::istream::tellg();
    local_2c0 = auVar12._8_8_;
    i = auVar12._0_8_;
    __off = std::fpos<__mbstate_t>::operator-
                      ((fpos<__mbstate_t> *)auStack_2a8,(fpos<__mbstate_t> *)&i);
    std::fpos<__mbstate_t>::fpos(&local_2b8,__off);
    auStack_2a8 = (undefined1  [8])local_2b8._M_off;
    fsize._M_off._0_4_ = local_2b8._M_state.__count;
    fsize._M_off._4_4_ = local_2b8._M_state.__value;
    uVar10 = std::fpos::operator_cast_to_long((fpos *)auStack_2a8);
    auVar12._8_8_ = 0;
    auVar12._0_8_ = this->size_;
    auVar12 = vpunpckldq_avx(auVar12,_DAT_001af380);
    auVar12 = vsubpd_avx(auVar12,_DAT_001af390);
    auVar7 = vpermilpd_avx(auVar12,1);
    dVar6 = (auVar7._0_8_ + auVar12._0_8_) * 1.5;
    uVar11 = (ulong)dVar6;
    if (uVar10 != (uVar11 | (long)(dVar6 - 9.223372036854776e+18) & (long)uVar11 >> 0x3f)) {
      __assert_fail("fsize == static_cast<size_t>(1.5 * size_)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/magic3007[P]intel-simd/yuv_420.cpp"
                    ,0x20,"int YUV420::ReadFromYUVFile(const string &)");
    }
    std::istream::read(local_240,(long)puVar1);
    for (j = 0; j < this->height_; j = j + 2) {
      for (uStack_2d8 = 0; uStack_2d8 < this->width_; uStack_2d8 = uStack_2d8 + 2) {
        std::istream::read(local_240,(long)&i_1 + 7);
        puVar3[uStack_2d8 + (j + 1) * sVar2 + 1] = i_1._7_1_;
        puVar3[uStack_2d8 + sVar2 * j + 1] = i_1._7_1_;
        puVar3[uStack_2d8 + (j + 1) * sVar2] = i_1._7_1_;
        puVar3[uStack_2d8 + sVar2 * j] = i_1._7_1_;
      }
    }
    for (j_1 = 0; j_1 < this->height_; j_1 = j_1 + 2) {
      for (uStack_2f0 = 0; uStack_2f0 < this->width_; uStack_2f0 = uStack_2f0 + 2) {
        std::istream::read(local_240,(long)&local_2f1);
        puVar5[uStack_2f0 + (j_1 + 1) * sVar4 + 1] = local_2f1;
        puVar5[uStack_2f0 + sVar4 * j_1 + 1] = local_2f1;
        puVar5[uStack_2f0 + (j_1 + 1) * sVar4] = local_2f1;
        puVar5[uStack_2f0 + sVar4 * j_1] = local_2f1;
      }
    }
    this_local._4_4_ = 0;
    __deferred__27.f_._M_invoker._0_4_ = 1;
    DeferredAction::~DeferredAction((DeferredAction *)local_270);
  }
  std::ifstream::~ifstream(local_240);
  return this_local._4_4_;
}

Assistant:

int YUV420::ReadFromYUVFile(const string &filename) {
  auto y = reinterpret_cast<uint8_t (*)[width_]>(y_);
  auto u = reinterpret_cast<uint8_t (*)[width_]>(u_);
  auto v = reinterpret_cast<uint8_t (*)[width_]>(v_);

  std::ifstream infile(filename, std::ifstream::in | std::ifstream::binary | std::ifstream::ate);
  if (!infile.is_open()){ return -1;}
  DEFER({infile.close();});

  std::streampos fsize = infile.tellg();
  infile.seekg(0, std::ifstream::beg);
  fsize = fsize - infile.tellg();
  assert(fsize == static_cast<size_t>(1.5 * size_));

  infile.read(reinterpret_cast<char *>(y), size_);
  for(size_t i = 0; i < height_; i+=2){
    for(size_t j = 0; j < width_; j+=2){
      uint8_t temp;
      infile.read(reinterpret_cast<char *>(&temp), 1);
      u[i][j] = u[i + 1][j] = u[i][j + 1] = u[i + 1][j + 1] = temp;
    }
  }

  for(size_t i = 0; i < height_; i += 2){
    for(size_t j = 0; j < width_; j += 2){
      uint8_t temp;
      infile.read(reinterpret_cast<char *>(&temp), 1);
      v[i][j] = v[i + 1][j] = v[i][j + 1] = v[i + 1][j + 1] = temp;
    }
  }
  return 0;
}